

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void run_schnorrsig_tests(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  int iVar151;
  uint32_t uVar152;
  uint32_t uVar153;
  long lVar154;
  secp256k1_context *psVar155;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar156;
  ulong uVar157;
  size_t in_RCX;
  secp256k1_context *psVar158;
  secp256k1_context *key32;
  ulong uVar159;
  secp256k1_context *psVar160;
  ulong uVar161;
  uint uVar162;
  ulong uVar164;
  ulong uVar165;
  code *unaff_RBP;
  ulong uVar166;
  secp256k1_context *nonce32;
  ulong uVar167;
  size_t in_R8;
  ulong uVar168;
  ulong uVar169;
  uchar *puVar170;
  secp256k1_context *pubkey;
  ulong uVar171;
  secp256k1_context *keypair;
  byte bVar172;
  uchar aux_rand [32];
  uchar algo [13];
  uchar *args [5];
  uchar nonce_z [32];
  uchar key [32];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_xonly_pubkey pk_1 [3];
  secp256k1_sha256 sha;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  secp256k1_fe sStackY_4a0;
  ulong uStackY_478;
  ulong uStackY_470;
  ulong uStackY_468;
  ulong uStackY_460;
  long lStackY_458;
  ulong uStackY_450;
  ulong uStackY_448;
  ulong uStackY_440;
  ulong uStackY_438;
  long lStackY_430;
  secp256k1_schnorrsig_extraparams *psStackY_428;
  secp256k1_context *psStackY_420;
  secp256k1_context *psStackY_418;
  secp256k1_context *psStackY_410;
  secp256k1_context *psStackY_408;
  code *pcStackY_400;
  int local_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [32];
  undefined1 local_398 [56];
  undefined8 uStack_360;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [64];
  undefined1 local_2f8 [64];
  undefined1 local_2b8 [48];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_228 [96];
  void *local_1c8;
  secp256k1_xonly_pubkey local_1a8;
  undefined1 local_168 [192];
  secp256k1_keypair local_a8;
  undefined1 local_48 [16];
  void *local_38;
  secp256k1_schnorrsig_extraparams *psVar163;
  
  local_398._40_8_ = local_398._32_8_;
  psVar160 = (secp256k1_context *)local_3b8;
  local_3b8._8_5_ = 0x65636e6f6e;
  local_3b8[0] = 'B';
  local_3b8[1] = 'I';
  local_3b8[2] = 'P';
  local_3b8[3] = '0';
  local_3b8._4_4_ = 0x2f303433;
  pcStackY_400 = (code *)0x14232f;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/nonce",0xd);
  local_228._0_8_ = 0xf4bfbff746615b35;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83627ab39f8dc671;
  local_228._16_8_ = (void *)0x5735866160217180;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x68b07b4c21a29e54;
  local_1c8 = (void *)0x40;
  pcStackY_400 = (code *)0x142363;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  pcStackY_400 = (code *)0x142377;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/auxBIP0340/nonce",0xb);
  local_228._0_8_ = 0x4eba7e7024dd3219;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xfa3166dca0fabb9;
  local_228._16_8_ = (void *)0x4c44df973afbe4b1;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x249e850a4aac2739;
  local_1c8 = (void *)0x40;
  pcStackY_400 = (code *)0x14239f;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  pcStackY_400 = (code *)0x1423af;
  secp256k1_testrand256(local_2b8);
  psVar156 = (secp256k1_context *)local_2f8;
  pcStackY_400 = (code *)0x1423bf;
  secp256k1_testrand256((uchar *)psVar156);
  pubkey = (secp256k1_context *)(local_2f8 + 0x20);
  pcStackY_400 = (code *)0x1423cf;
  secp256k1_testrand256((uchar *)pubkey);
  psVar163 = (secp256k1_schnorrsig_extraparams *)local_3d8;
  pcStackY_400 = (code *)0x1423dc;
  secp256k1_testrand256((uchar *)psVar163);
  local_398._16_8_ = pubkey;
  local_398._24_8_ = psVar160;
  local_398._0_8_ = local_2b8;
  local_398._8_8_ = psVar156;
  local_398._32_8_ = psVar163;
  if (0 < COUNT) {
    psVar163 = (secp256k1_schnorrsig_extraparams *)0x0;
    do {
      pcStackY_400 = (code *)0x142417;
      nonce_function_bip340_bitflip((uchar **)local_398,0,0x20,in_RCX,in_R8);
      pcStackY_400 = (code *)0x142429;
      nonce_function_bip340_bitflip((uchar **)local_398,1,0x20,in_RCX,in_R8);
      pcStackY_400 = (code *)0x14243b;
      nonce_function_bip340_bitflip((uchar **)local_398,2,0x20,in_RCX,in_R8);
      pcStackY_400 = (code *)0x14244d;
      nonce_function_bip340_bitflip((uchar **)local_398,3,0xd,in_RCX,in_R8);
      pcStackY_400 = (code *)0x14245f;
      nonce_function_bip340_bitflip((uchar **)local_398,3,0xd,in_RCX,in_R8);
      pcStackY_400 = (code *)0x142471;
      nonce_function_bip340_bitflip((uchar **)local_398,4,0x20,in_RCX,in_R8);
      uVar162 = (int)psVar163 + 1;
      psVar163 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar162;
    } while ((int)uVar162 < COUNT);
  }
  key32 = (secp256k1_context *)local_2f8;
  pcStackY_400 = (code *)0x1424bb;
  iVar151 = nonce_function_bip340
                      (local_288,local_2b8,0x20,(uchar *)key32,local_2f8 + 0x20,local_3b8,0xd,
                       (void *)0x0);
  if (iVar151 == 0) goto LAB_0014466b;
  keypair = (secp256k1_context *)local_3b8;
  pcStackY_400 = (code *)0x1424d5;
  secp256k1_testrand_bytes_test((uchar *)keypair,0xd);
  key32 = (secp256k1_context *)local_2f8;
  pcStackY_400 = (code *)0x142513;
  iVar151 = nonce_function_bip340
                      (local_288,local_2b8,0x20,(uchar *)key32,local_2f8 + 0x20,(uchar *)keypair,0xd
                       ,(void *)0x0);
  if (iVar151 == 0) goto LAB_00144670;
  if (0 < COUNT) {
    psVar163 = (secp256k1_schnorrsig_extraparams *)0x0;
    keypair = (secp256k1_context *)local_338;
    psVar156 = (secp256k1_context *)local_2b8;
    pubkey = (secp256k1_context *)local_2f8;
    psVar160 = (secp256k1_context *)(local_2f8 + 0x20);
    unaff_RBP = (code *)local_3b8;
    do {
      pcStackY_400 = (code *)0x142559;
      uVar152 = secp256k1_testrand_int(0x1f);
      pcStackY_400 = (code *)0x142584;
      key32 = pubkey;
      iVar151 = nonce_function_bip340
                          ((uchar *)keypair,(uchar *)psVar156,(ulong)(uVar152 & 0x1f),
                           (uchar *)pubkey,(uchar *)psVar160,(uchar *)unaff_RBP,0xd,(void *)0x0);
      if (iVar151 == 0) goto LAB_001445c1;
      lVar154 = 0;
      while (key32 = (secp256k1_context *)CONCAT71((int7)((ulong)key32 >> 8),local_288[lVar154]),
            local_288[lVar154] == local_338[lVar154]) {
        lVar154 = lVar154 + 1;
        if (lVar154 == 0x20) goto LAB_00144661;
      }
      pcStackY_400 = (code *)0x1425b6;
      uVar152 = secp256k1_testrand_int(0xc);
      pcStackY_400 = (code *)0x1425fd;
      key32 = pubkey;
      iVar151 = nonce_function_bip340
                          ((uchar *)keypair,(uchar *)psVar156,0x20,(uchar *)pubkey,(uchar *)psVar160
                           ,(uchar *)unaff_RBP,((ulong)uVar152 + 0xd) % 0xd,(void *)0x0);
      if (iVar151 == 0) goto LAB_001445c6;
      lVar154 = 0;
      while (key32 = (secp256k1_context *)CONCAT71((int7)((ulong)key32 >> 8),local_288[lVar154]),
            local_288[lVar154] == local_338[lVar154]) {
        lVar154 = lVar154 + 1;
        if (lVar154 == 0x20) goto LAB_00144666;
      }
      uVar162 = (int)psVar163 + 1;
      psVar163 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar162;
    } while ((int)uVar162 < COUNT);
  }
  local_3c8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  key32 = (secp256k1_context *)local_2f8;
  pcStackY_400 = (code *)0x142684;
  iVar151 = nonce_function_bip340
                      (local_338,local_2b8,0x20,(uchar *)key32,local_2f8 + 0x20,local_3b8,0xd,
                       local_3d8);
  if (iVar151 == 0) goto LAB_00144675;
  nonce32 = (secp256k1_context *)local_288;
  key32 = (secp256k1_context *)local_2f8;
  pcStackY_400 = (code *)0x1426cc;
  iVar151 = nonce_function_bip340
                      ((uchar *)nonce32,local_2b8,0x20,(uchar *)key32,local_2f8 + 0x20,local_3b8,0xd
                       ,(void *)0x0);
  psVar158 = CTX;
  psVar155 = secp256k1_context_static;
  if (iVar151 == 0) goto LAB_0014467a;
  lVar154 = 0;
  do {
    if (local_338[lVar154] != local_288[lVar154]) goto LAB_00144886;
    lVar154 = lVar154 + 1;
  } while (lVar154 != 0x20);
  local_348 = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  stack0xfffffffffffffc98 = (undefined1  [16])0x0;
  local_398._32_8_ = (secp256k1_schnorrsig_extraparams *)0x0;
  local_398._40_8_ = 0;
  local_398._16_8_ = (secp256k1_context *)0x0;
  local_398._24_8_ = (secp256k1_context *)0x0;
  local_398._0_8_ = (uchar *)0x0;
  local_398._8_8_ = (secp256k1_context *)0x0;
  local_3b8._16_8_ = (void *)0x0;
  local_3b8[0] = 0xda;
  local_3b8[1] = 'o';
  local_3b8[2] = 0xb3;
  local_3b8[3] = 0x8c;
  local_3b8._4_4_ = 0;
  local_3b8._8_5_ = 0;
  local_3b8._13_3_ = 0;
  local_48 = (undefined1  [16])0x0;
  local_38 = (void *)0x0;
  local_3dc = 0;
  key32 = CTX;
  if (secp256k1_context_static == CTX) goto LAB_0014467f;
  (CTX->error_callback).fn = counting_illegal_callback_fn;
  (psVar158->error_callback).data = &local_3dc;
  do {
    if (psVar155 == psVar158) {
      pcStackY_400 = (code *)0x1446ba;
      (*(psVar158->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar158->illegal_callback).data);
      psVar155 = secp256k1_context_static;
    }
    else {
      (psVar158->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar158->illegal_callback).data = &local_3dc;
    }
    psVar160 = STATIC_CTX;
    if (psVar155 == STATIC_CTX) {
      pcStackY_400 = (code *)0x1446da;
      (*(STATIC_CTX->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(STATIC_CTX->illegal_callback).data);
      psVar155 = secp256k1_context_static;
      psVar160 = STATIC_CTX;
    }
    else {
      (STATIC_CTX->error_callback).fn = counting_illegal_callback_fn;
      (psVar160->error_callback).data = &local_3dc;
    }
    if (psVar155 == psVar160) {
      pcStackY_400 = (code *)0x144701;
      (*(psVar160->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar160->illegal_callback).data);
    }
    else {
      (psVar160->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar160->illegal_callback).data = &local_3dc;
    }
    pcStackY_400 = (code *)0x14280d;
    secp256k1_testrand256(local_2b8);
    pcStackY_400 = (code *)0x14281a;
    secp256k1_testrand256(local_2f8);
    pcStackY_400 = (code *)0x142827;
    secp256k1_testrand256(local_2f8 + 0x20);
    pcStackY_400 = (code *)0x142831;
    secp256k1_testrand256(local_3d8);
    pcStackY_400 = (code *)0x142848;
    iVar151 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,local_2b8);
    if (iVar151 == 0) {
      pcStackY_400 = (code *)0x14470b;
      run_schnorrsig_tests_cold_97();
LAB_0014470b:
      pcStackY_400 = (code *)0x144710;
      run_schnorrsig_tests_cold_96();
LAB_00144710:
      pcStackY_400 = (code *)0x144715;
      run_schnorrsig_tests_cold_95();
LAB_00144715:
      pcStackY_400 = (code *)0x14471a;
      run_schnorrsig_tests_cold_94();
LAB_0014471a:
      pcStackY_400 = (code *)0x14471f;
      run_schnorrsig_tests_cold_93();
LAB_0014471f:
      pcStackY_400 = (code *)0x144724;
      run_schnorrsig_tests_cold_92();
LAB_00144724:
      pcStackY_400 = (code *)0x144729;
      run_schnorrsig_tests_cold_91();
LAB_00144729:
      pcStackY_400 = (code *)0x14472e;
      run_schnorrsig_tests_cold_2();
LAB_0014472e:
      pcStackY_400 = (code *)0x144733;
      run_schnorrsig_tests_cold_3();
LAB_00144733:
      pcStackY_400 = (code *)0x144738;
      run_schnorrsig_tests_cold_4();
LAB_00144738:
      pcStackY_400 = (code *)0x14473d;
      run_schnorrsig_tests_cold_5();
LAB_0014473d:
      pcStackY_400 = (code *)0x144742;
      run_schnorrsig_tests_cold_6();
LAB_00144742:
      pcStackY_400 = (code *)0x144747;
      run_schnorrsig_tests_cold_7();
LAB_00144747:
      pcStackY_400 = (code *)0x14474c;
      run_schnorrsig_tests_cold_8();
LAB_0014474c:
      pcStackY_400 = (code *)0x144751;
      run_schnorrsig_tests_cold_9();
LAB_00144751:
      pcStackY_400 = (code *)0x144756;
      run_schnorrsig_tests_cold_10();
LAB_00144756:
      pcStackY_400 = (code *)0x14475b;
      run_schnorrsig_tests_cold_11();
LAB_0014475b:
      pcStackY_400 = (code *)0x144760;
      run_schnorrsig_tests_cold_12();
LAB_00144760:
      pcStackY_400 = (code *)0x144765;
      run_schnorrsig_tests_cold_90();
LAB_00144765:
      pcStackY_400 = (code *)0x14476a;
      run_schnorrsig_tests_cold_13();
LAB_0014476a:
      pcStackY_400 = (code *)0x14476f;
      run_schnorrsig_tests_cold_14();
LAB_0014476f:
      pcStackY_400 = (code *)0x144774;
      run_schnorrsig_tests_cold_15();
LAB_00144774:
      pcStackY_400 = (code *)0x144779;
      run_schnorrsig_tests_cold_16();
LAB_00144779:
      pcStackY_400 = (code *)0x14477e;
      run_schnorrsig_tests_cold_17();
LAB_0014477e:
      pcStackY_400 = (code *)0x144783;
      run_schnorrsig_tests_cold_89();
LAB_00144783:
      pcStackY_400 = (code *)0x144788;
      run_schnorrsig_tests_cold_18();
LAB_00144788:
      pcStackY_400 = (code *)0x14478d;
      run_schnorrsig_tests_cold_19();
LAB_0014478d:
      pcStackY_400 = (code *)0x144792;
      run_schnorrsig_tests_cold_20();
LAB_00144792:
      pcStackY_400 = (code *)0x144797;
      run_schnorrsig_tests_cold_21();
LAB_00144797:
      pcStackY_400 = (code *)0x14479c;
      run_schnorrsig_tests_cold_22();
LAB_0014479c:
      pcStackY_400 = (code *)0x1447a1;
      run_schnorrsig_tests_cold_88();
LAB_001447a1:
      pcStackY_400 = (code *)0x1447a6;
      run_schnorrsig_tests_cold_23();
LAB_001447a6:
      pcStackY_400 = (code *)0x1447ab;
      run_schnorrsig_tests_cold_24();
LAB_001447ab:
      pcStackY_400 = (code *)0x1447b0;
      run_schnorrsig_tests_cold_25();
LAB_001447b0:
      pcStackY_400 = (code *)0x1447b5;
      run_schnorrsig_tests_cold_26();
LAB_001447b5:
      pcStackY_400 = (code *)0x1447ba;
      run_schnorrsig_tests_cold_27();
LAB_001447ba:
      pcStackY_400 = (code *)0x1447bf;
      run_schnorrsig_tests_cold_87();
LAB_001447bf:
      pcStackY_400 = (code *)0x1447c4;
      run_schnorrsig_tests_cold_86();
LAB_001447c4:
      pcStackY_400 = (code *)0x1447c9;
      run_schnorrsig_tests_cold_28();
LAB_001447c9:
      pcStackY_400 = (code *)0x1447ce;
      run_schnorrsig_tests_cold_29();
LAB_001447ce:
      pcStackY_400 = (code *)0x1447d3;
      run_schnorrsig_tests_cold_30();
LAB_001447d3:
      pcStackY_400 = (code *)0x1447d8;
      run_schnorrsig_tests_cold_31();
LAB_001447d8:
      pcStackY_400 = (code *)0x1447dd;
      run_schnorrsig_tests_cold_32();
LAB_001447dd:
      pcStackY_400 = (code *)0x1447e2;
      run_schnorrsig_tests_cold_33();
LAB_001447e2:
      pcStackY_400 = (code *)0x1447e7;
      run_schnorrsig_tests_cold_34();
LAB_001447e7:
      pcStackY_400 = (code *)0x1447ec;
      run_schnorrsig_tests_cold_35();
      psVar156 = extraout_RAX;
LAB_001447ec:
      pcStackY_400 = (code *)0x144800;
      (*(psVar156->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar156->illegal_callback).data);
      psVar156 = STATIC_CTX;
      psVar160 = secp256k1_context_static;
    }
    else {
      pcStackY_400 = (code *)0x14286f;
      iVar151 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)(local_168 + 0x60),local_2f8);
      if (iVar151 == 0) goto LAB_0014470b;
      pcStackY_400 = (code *)0x142896;
      iVar151 = secp256k1_keypair_create(CTX,&local_a8,local_2f8 + 0x20);
      if (iVar151 == 0) goto LAB_00144710;
      pcStackY_400 = (code *)0x1428bc;
      iVar151 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                           (secp256k1_keypair *)local_168);
      if (iVar151 == 0) goto LAB_00144715;
      pcStackY_400 = (code *)0x1428dd;
      iVar151 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)(local_228 + 0x40),(int *)0x0,
                           (secp256k1_keypair *)(local_168 + 0x60));
      if (iVar151 == 0) goto LAB_0014471a;
      pcStackY_400 = (code *)0x1428fe;
      iVar151 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,&local_a8);
      if (iVar151 == 0) goto LAB_0014471f;
      local_258 = (undefined1  [16])0x0;
      local_268 = (undefined1  [16])0x0;
      local_278 = (undefined1  [16])0x0;
      local_288 = (undefined1  [16])0x0;
      local_3dc = 0;
      pcStackY_400 = (code *)0x14296b;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 == 0) goto LAB_00144724;
      if (local_3dc != 0) goto LAB_00144729;
      pcStackY_400 = (code *)0x1429ad;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 != 0) goto LAB_0014472e;
      if (local_3dc != 1) goto LAB_00144733;
      pcStackY_400 = (code *)0x1429f2;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_338,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 != 0) goto LAB_00144738;
      if (local_3dc != 2) goto LAB_0014473d;
      pcStackY_400 = (code *)0x142a35;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)0x0,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 != 0) goto LAB_00144742;
      if (local_3dc != 3) goto LAB_00144747;
      pcStackY_400 = (code *)0x142a7a;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_398,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 != 0) goto LAB_0014474c;
      if (local_3dc != 4) goto LAB_00144751;
      pcStackY_400 = (code *)0x142ac2;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (STATIC_CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 != 0) goto LAB_00144756;
      if (local_3dc != 5) goto LAB_0014475b;
      local_3dc = 0;
      pcStackY_400 = (code *)0x142b08;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           (secp256k1_schnorrsig_extraparams *)local_3b8);
      if (iVar151 == 0) goto LAB_00144760;
      if (local_3dc != 0) goto LAB_00144765;
      pcStackY_400 = (code *)0x142b40;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           (secp256k1_schnorrsig_extraparams *)local_3b8);
      if (iVar151 != 0) goto LAB_0014476a;
      if (local_3dc != 1) goto LAB_0014476f;
      pcStackY_400 = (code *)0x142b7b;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_338,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                           (secp256k1_schnorrsig_extraparams *)local_3b8);
      if (iVar151 != 0) goto LAB_00144774;
      if (local_3dc != 2) goto LAB_00144779;
      pcStackY_400 = (code *)0x142bb3;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_338,(uchar *)0x0,0,(secp256k1_keypair *)local_168,
                           (secp256k1_schnorrsig_extraparams *)local_3b8);
      if (iVar151 == 0) goto LAB_0014477e;
      if (local_3dc != 2) goto LAB_00144783;
      pcStackY_400 = (code *)0x142bec;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)0x0,
                           (secp256k1_schnorrsig_extraparams *)local_3b8);
      if (iVar151 != 0) goto LAB_00144788;
      if (local_3dc != 3) goto LAB_0014478d;
      pcStackY_400 = (code *)0x142c27;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_398,
                           (secp256k1_schnorrsig_extraparams *)local_3b8);
      if (iVar151 != 0) goto LAB_00144792;
      if (local_3dc != 4) goto LAB_00144797;
      pcStackY_400 = (code *)0x142c6b;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      if (iVar151 == 0) goto LAB_0014479c;
      if (local_3dc != 4) goto LAB_001447a1;
      pcStackY_400 = (code *)0x142cac;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           (secp256k1_schnorrsig_extraparams *)local_48);
      if (iVar151 != 0) goto LAB_001447a6;
      if (local_3dc != 5) goto LAB_001447ab;
      pcStackY_400 = (code *)0x142cea;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (STATIC_CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           (secp256k1_schnorrsig_extraparams *)local_3b8);
      if (iVar151 != 0) goto LAB_001447b0;
      if (local_3dc != 6) goto LAB_001447b5;
      local_3dc = 0;
      pcStackY_400 = (code *)0x142d3a;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 == 0) goto LAB_001447ba;
      pcStackY_400 = (code *)0x142d68;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_338,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_228);
      if (iVar151 == 0) goto LAB_001447bf;
      if (local_3dc != 0) goto LAB_001447c4;
      pcStackY_400 = (code *)0x142d96;
      (*(CTX->illegal_callback).fn)("sig64 != NULL",(CTX->illegal_callback).data);
      if (local_3dc != 1) goto LAB_001447c9;
      pcStackY_400 = (code *)0x142dbc;
      (*(CTX->illegal_callback).fn)("msg != NULL || msglen == 0",(CTX->illegal_callback).data);
      if (local_3dc != 2) goto LAB_001447ce;
      pcStackY_400 = (code *)0x142de7;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_338,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)local_228);
      if (iVar151 != 0) goto LAB_001447d3;
      if (local_3dc != 2) goto LAB_001447d8;
      pcStackY_400 = (code *)0x142e15;
      (*(CTX->illegal_callback).fn)("pubkey != NULL",(CTX->illegal_callback).data);
      if (local_3dc != 3) goto LAB_001447dd;
      pcStackY_400 = (code *)0x142e46;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_338,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_288);
      psVar156 = STATIC_CTX;
      psVar160 = secp256k1_context_static;
      if (iVar151 != 0) goto LAB_001447e2;
      if (local_3dc != 4) goto LAB_001447e7;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_001447ec;
      (STATIC_CTX->error_callback).fn = secp256k1_default_error_callback_fn;
      (psVar156->error_callback).data = (void *)0x0;
    }
    if (psVar160 == psVar156) {
      pcStackY_400 = (code *)0x144827;
      (*(psVar156->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar156->illegal_callback).data);
    }
    else {
      (psVar156->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
      (psVar156->illegal_callback).data = (void *)0x0;
    }
    pcStackY_400 = (code *)0x142ec7;
    secp256k1_sha256_initialize_tagged
              ((secp256k1_sha256 *)local_168,(uchar *)"BIP0340/challenge",0x11);
    local_228._0_8_ = 0x239253819cecba11;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd1627e0f11679112;
    local_228._16_8_ = (void *)0x3cc76597c87550;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x33e9b66a90f61164;
    local_1c8 = (void *)0x40;
    pcStackY_400 = (code *)0x142ef7;
    test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
    local_228._16_8_ = (void *)0x0;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x300000000000000;
    local_228._0_8_ = 0;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_398._16_8_ = 0xb0996f8345c831b5;
    local_398._24_8_ = 0xf936e0bc13f10186;
    local_398._0_8_ = (uchar *)0x10c35892018a30f9;
    local_398._8_8_ = 0x29529df8854f3449;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_338._16_8_ = (void *)0x0;
    local_338._24_8_ = 0;
    local_338._0_8_ = 0;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_168._48_8_ = 0x472f17b2fde8eeeb;
    local_168._56_8_ = 0xc03605310d90f47d;
    local_168._32_8_ = 0x718bea854a6af625;
    local_168._40_8_ = 0xe52c2d384fa782e4;
    local_168._16_8_ = 0x8b007835f1cdf4b;
    local_168._24_8_ = 0x1582ca2dcef1554c;
    local_168._0_8_ = (void *)0x108d84801f8307e9;
    local_168._8_8_ = 0x361024401b37a569;
    pcStackY_400 = (code *)0x142fa8;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338,0x20,local_168);
    pcStackY_400 = (code *)0x142fc1;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338,0x20,local_168,1);
    local_228._16_8_ = (void *)0x56dab4380f16e762;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0xefcf905104d984a7;
    local_228._0_8_ = 0x6a2aed8a6251e1b7;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xc7f3f49c805871bf;
    local_398._16_8_ = 0xd8cedea21daefe58;
    local_398._24_8_ = 0x59a62b507b0f2443;
    local_398._0_8_ = (uchar *)0x5f1c672a7fd7f1df;
    local_398._8_8_ = 0xbe4123db26371836;
    local_278._0_8_ = (void *)0x0;
    local_278._8_8_ = 0x100000000000000;
    local_288 = ZEXT816(0);
    local_338._16_8_ = (void *)0xd0319f29223809a4;
    local_338._24_8_ = 0x896c4eec98fa2e08;
    local_338._0_8_ = 0xd308a385886a3f24;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    local_168._48_8_ = 0x1c87ea39b6fc7e89;
    local_168._56_8_ = 0xa4b9e33def695fa;
    local_168._32_8_ = 0xccab76c91ad10689;
    local_168._40_8_ = 0xeaf4bf9212090bb2;
    local_168._16_8_ = 0x17f9436d3e41de1b;
    local_168._24_8_ = 0x4133de788ccf8ddc;
    local_168._0_8_ = (void *)0x6d29aeee60bd9668;
    local_168._8_8_ = 0x7fe1df79f228ab4;
    pcStackY_400 = (code *)0x14308e;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338,0x20,local_168);
    pcStackY_400 = (code *)0x1430a7;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338,0x20,local_168,1);
    local_228._16_8_ = (void *)0x74cc678a084e0229;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0xc9e5143ba6be0b02;
    local_228._0_8_ = 0x34c26821a2da0fc9;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd11cdc808b62c6c4;
    local_398._16_8_ = 0xc986b00953713901;
    local_398._24_8_ = 0xb84e7769d98fe160;
    local_398._0_8_ = (uchar *)0x137e77c5fe8a30dd;
    local_398._8_8_ = 0xccb7c19c2ba71f12;
    local_278._8_8_ = 0x6d9e698d7620b4b;
    local_278._0_8_ = 0x2c69d1c6cd760e08;
    local_288._8_8_ = 0xccbcbbb5a235b02e;
    local_288._0_8_ = 0xaed7b42438a57ac8;
    local_338._16_8_ = (void *)0x33776cb5aa0598da;
    local_338._24_8_ = 0x5cb708a5d0b92430;
    local_338._0_8_ = 0x1adfbcb3d8582d7e;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0xdf9549082c7deba;
    local_168._48_8_ = 0x1e48f8828da9de7a;
    local_168._56_8_ = 0xb73f6f4a67031e0e;
    local_168._32_8_ = 0x4a95ada5795874ab;
    local_168._40_8_ = 0x3c1da5c3915ac472;
    local_168._16_8_ = 0x8b8d72602acf9bc4;
    local_168._24_8_ = 0x1b3c31dd500f204c;
    local_168._0_8_ = (void *)0xb74bb4d7eeaa3158;
    local_168._8_8_ = 0x94429dba94ab5e4e;
    psVar155 = (secp256k1_context *)local_228;
    pcStackY_400 = (code *)0x143170;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)psVar155,local_398,local_288,local_338,0x20,local_168);
    pcStackY_400 = (code *)0x143189;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338,0x20,local_168,1);
    local_228._16_8_ = (void *)0x54a23fcf62307712;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x101740d28ef5449e;
    local_228._0_8_ = 0x81739377262b430b;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd0ec662ab05bf0ae;
    local_398._16_8_ = 0x8a461df2fb950d3a;
    local_398._24_8_ = 0x17f5d860c1f8331b;
    local_398._0_8_ = (uchar *)0x25f50551f9dfd125;
    local_398._8_8_ = 0xad96a928f622403c;
    local_278._8_4_ = 0xffffffff;
    local_278._0_8_ = 0xffffffffffffffff;
    local_278._12_4_ = 0xffffffff;
    local_288._8_4_ = 0xffffffff;
    local_288._0_8_ = 0xffffffffffffffff;
    local_288._12_4_ = 0xffffffff;
    local_338._16_8_ = (void *)0xffffffffffffffff;
    local_338._24_8_ = 0xffffffffffffffff;
    local_338._0_8_ = 0xffffffffffffffff;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    local_168._48_8_ = 0x27b3eb8188d75ff2;
    local_168._56_8_ = 0xa36ec6ef2259fc71;
    local_168._32_8_ = 0x93b33db19c2b5897;
    local_168._40_8_ = 0x5aaf82a92bb30537;
    local_168._16_8_ = 0xb651dd87a1c1ec65;
    local_168._24_8_ = 0xecd53796dc1eda4f;
    local_168._0_8_ = (void *)0xf146e2579750b07e;
    local_168._8_8_ = 0xb91c615156884994;
    psVar156 = (secp256k1_context *)local_228;
    pubkey = (secp256k1_context *)local_338;
    pcStackY_400 = (code *)0x14323d;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)psVar156,local_398,local_288,(uchar *)pubkey,0x20,local_168);
    pcStackY_400 = (code *)0x143256;
    test_schnorrsig_bip_vectors_check_verify(local_398,(uchar *)pubkey,0x20,local_168,1);
    local_228._16_8_ = (void *)0xaae28b6d7430fa7d;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0xb9c72dd2295f9765;
    local_228._0_8_ = 0x12e499bb09359cd6;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83724e54e80f8be6;
    local_398._16_8_ = (secp256k1_context *)0x9b591ac87578f199;
    local_398._24_8_ = (secp256k1_context *)0x36769b989986c56;
    local_398._0_8_ = (uchar *)0xb283cc8ff6c3f34d;
    local_398._8_8_ = (secp256k1_context *)0x24a73104c9429d7e;
    local_168._48_8_ = 0x93f5804ec071cb60;
    local_168._56_8_ = 0xf4d70883d2070b06;
    local_168._32_8_ = 0xb303f68a54b1af76;
    local_168._40_8_ = 0x10ee7d20f8c945eb;
    local_168._16_8_ = 0x28aaf51494eda089;
    local_168._24_8_ = 0x639c5f79d6960dad;
    local_168._0_8_ = (void *)0x0;
    local_168._8_8_ = 0x3f56ce783b000000;
    pcStackY_400 = (code *)0x1432d7;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,1);
    local_228._16_8_ = (void *)0x8776b979ae9898eb;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x344a2d4aa0fae466;
    local_228._0_8_ = 0x507767db4ceafdee;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x21cfea07e8fe20a4;
    pcStackY_400 = (code *)0x143308;
    nonce32 = CTX;
    iVar151 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar151 != 0) {
      pcStackY_400 = (code *)0x144831;
      run_schnorrsig_tests_cold_36();
LAB_00144831:
      keypair = (secp256k1_context *)local_398;
      psVar163 = (secp256k1_schnorrsig_extraparams *)local_228;
      pcStackY_400 = (code *)0x144836;
      run_schnorrsig_tests_cold_37();
LAB_00144836:
      pcStackY_400 = (code *)0x14483b;
      run_schnorrsig_tests_cold_61();
LAB_0014483b:
      pcStackY_400 = (code *)0x144840;
      run_schnorrsig_tests_cold_60();
LAB_00144840:
      pcStackY_400 = (code *)0x144845;
      run_schnorrsig_tests_cold_59();
LAB_00144845:
      pcStackY_400 = (code *)0x14484a;
      run_schnorrsig_tests_cold_50();
LAB_0014484a:
      pcStackY_400 = (code *)0x14484f;
      run_schnorrsig_tests_cold_58();
LAB_0014484f:
      pcStackY_400 = (code *)0x144854;
      run_schnorrsig_tests_cold_57();
LAB_00144854:
      pcStackY_400 = (code *)0x144859;
      run_schnorrsig_tests_cold_56();
LAB_00144859:
      pcStackY_400 = (code *)0x14485e;
      run_schnorrsig_tests_cold_55();
LAB_0014485e:
      pcStackY_400 = (code *)0x144863;
      run_schnorrsig_tests_cold_54();
LAB_00144863:
      pcStackY_400 = (code *)0x144868;
      run_schnorrsig_tests_cold_53();
LAB_00144868:
      pcStackY_400 = (code *)0x14486d;
      run_schnorrsig_tests_cold_52();
LAB_0014486d:
      pcStackY_400 = (code *)0x144872;
      run_schnorrsig_tests_cold_51();
LAB_00144872:
      psVar160 = psVar156;
      pcStackY_400 = (code *)0x144877;
      run_schnorrsig_tests_cold_38();
LAB_00144877:
      pcStackY_400 = (code *)0x14487c;
      run_schnorrsig_tests_cold_40();
      psVar156 = psVar160;
LAB_0014487c:
      psVar160 = psVar155;
      pcStackY_400 = (code *)0x144881;
      run_schnorrsig_tests_cold_42();
LAB_00144881:
      pcStackY_400 = (code *)0x144886;
      run_schnorrsig_tests_cold_43();
LAB_00144886:
      pcStackY_400 = secp256k1_ge_is_valid_var;
      run_schnorrsig_tests_cold_1();
      if ((int)(nonce32->ecmult_gen_ctx).initial.y.n[0] == 0) {
        uVar159 = (nonce32->ecmult_gen_ctx).initial.x.n[0];
        uVar166 = (nonce32->ecmult_gen_ctx).initial.x.n[1];
        uVar167 = (nonce32->ecmult_gen_ctx).initial.x.n[2];
        uVar171 = (nonce32->ecmult_gen_ctx).initial.x.n[3];
        uVar161 = (nonce32->ecmult_gen_ctx).initial.x.n[4];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar159 * 2;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar171;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar166 * 2;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uVar167;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar161;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = uVar161;
        uVar157 = SUB168(auVar3 * auVar73,0);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar157 & 0xfffffffffffff;
        auVar129 = auVar2 * auVar72 + auVar1 * auVar71 + auVar4 * ZEXT816(0x1000003d10);
        uVar164 = auVar129._0_8_;
        auVar130._8_8_ = 0;
        auVar130._0_8_ = uVar164 >> 0x34 | auVar129._8_8_ << 0xc;
        uVar161 = uVar161 * 2;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar159;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = uVar161;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar166 * 2;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = uVar171;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar167;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = uVar167;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar157 >> 0x34 | SUB168(auVar3 * auVar73,8) << 0xc;
        auVar129 = auVar5 * auVar74 + auVar130 + auVar6 * auVar75 + auVar7 * auVar76 +
                   auVar8 * ZEXT816(0x1000003d10);
        uVar157 = auVar129._0_8_;
        auVar131._8_8_ = 0;
        auVar131._0_8_ = uVar157 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar159;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = uVar159;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar166;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uVar161;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar167 * 2;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = uVar171;
        auVar129 = auVar10 * auVar78 + auVar131 + auVar11 * auVar79;
        uVar165 = auVar129._0_8_;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = uVar165 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = (uVar165 & 0xfffffffffffff) << 4 | (uVar157 & 0xfffffffffffff) >> 0x30;
        auVar129 = auVar9 * auVar77 + ZEXT816(0x1000003d1) * auVar80;
        uVar165 = auVar129._0_8_;
        uStackY_450 = uVar165 & 0xfffffffffffff;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = uVar165 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar159 * 2;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uVar166;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar167;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar161;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar171;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = uVar171;
        auVar1 = auVar13 * auVar82 + auVar133 + auVar14 * auVar83;
        uVar165 = auVar1._0_8_;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar165 & 0xfffffffffffff;
        auVar129 = auVar12 * auVar81 + auVar132 + auVar15 * ZEXT816(0x1000003d10);
        uVar168 = auVar129._0_8_;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = uVar165 >> 0x34 | auVar1._8_8_ << 0xc;
        uStackY_448 = uVar168 & 0xfffffffffffff;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = uVar168 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar159 * 2;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uVar167;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar166;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = uVar166;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar171;
        auVar86._8_8_ = 0;
        auVar86._0_8_ = uVar161;
        auVar135 = auVar18 * auVar86 + auVar135;
        uVar159 = auVar135._0_8_;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar159 & 0xfffffffffffff;
        auVar129 = auVar16 * auVar84 + auVar134 + auVar17 * auVar85 +
                   auVar19 * ZEXT816(0x1000003d10);
        uVar166 = auVar129._0_8_;
        uStackY_440 = uVar166 & 0xfffffffffffff;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = (uVar166 >> 0x34 | auVar129._8_8_ << 0xc) + (uVar164 & 0xfffffffffffff);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar159 >> 0x34 | auVar135._8_8_ << 0xc;
        auVar136 = auVar20 * ZEXT816(0x1000003d10) + auVar136;
        uVar159 = auVar136._0_8_;
        uStackY_438 = uVar159 & 0xfffffffffffff;
        lStackY_430 = (uVar159 >> 0x34 | auVar136._8_8_ << 0xc) + (uVar157 & 0xffffffffffff);
        uVar159 = *(ulong *)&nonce32->ecmult_gen_ctx;
        uVar166 = (nonce32->ecmult_gen_ctx).blind.d[0];
        uVar167 = (nonce32->ecmult_gen_ctx).blind.d[1];
        uVar171 = (nonce32->ecmult_gen_ctx).blind.d[2];
        uVar161 = (nonce32->ecmult_gen_ctx).blind.d[3];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar159 * 2;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = uVar171;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar166 * 2;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = uVar167;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar161;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = uVar161;
        uVar157 = SUB168(auVar23 * auVar89,0);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar157 & 0xfffffffffffff;
        auVar129 = auVar22 * auVar88 + auVar21 * auVar87 + auVar24 * ZEXT816(0x1000003d10);
        uVar165 = auVar129._0_8_;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = uVar165 >> 0x34 | auVar129._8_8_ << 0xc;
        uVar161 = uVar161 * 2;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar159;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = uVar161;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar166 * 2;
        auVar91._8_8_ = 0;
        auVar91._0_8_ = uVar171;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar167;
        auVar92._8_8_ = 0;
        auVar92._0_8_ = uVar167;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar157 >> 0x34 | SUB168(auVar23 * auVar89,8) << 0xc;
        auVar129 = auVar25 * auVar90 + auVar137 + auVar26 * auVar91 + auVar27 * auVar92 +
                   auVar28 * ZEXT816(0x1000003d10);
        uVar168 = auVar129._0_8_;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = uVar168 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar159;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = uVar159;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar166;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = uVar161;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar167 * 2;
        auVar95._8_8_ = 0;
        auVar95._0_8_ = uVar171;
        auVar129 = auVar30 * auVar94 + auVar138 + auVar31 * auVar95;
        uVar157 = auVar129._0_8_;
        auVar140._8_8_ = 0;
        auVar140._0_8_ = uVar157 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar96._8_8_ = 0;
        auVar96._0_8_ = (uVar157 & 0xfffffffffffff) << 4 | (uVar168 & 0xfffffffffffff) >> 0x30;
        auVar129 = auVar29 * auVar93 + ZEXT816(0x1000003d1) * auVar96;
        uVar164 = auVar129._0_8_;
        uVar157 = uVar164 & 0xfffffffffffff;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = uVar164 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar159 * 2;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = uVar166;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar167;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = uVar161;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar171;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = uVar171;
        auVar1 = auVar33 * auVar98 + auVar140 + auVar34 * auVar99;
        uVar164 = auVar1._0_8_;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar164 & 0xfffffffffffff;
        auVar129 = auVar32 * auVar97 + auVar139 + auVar35 * ZEXT816(0x1000003d10);
        uVar169 = auVar129._0_8_;
        auVar142._8_8_ = 0;
        auVar142._0_8_ = uVar164 >> 0x34 | auVar1._8_8_ << 0xc;
        uVar164 = uVar169 & 0xfffffffffffff;
        auVar141._8_8_ = 0;
        auVar141._0_8_ = uVar169 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar159 * 2;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar167;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar166;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar166;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar171;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar161;
        auVar142 = auVar38 * auVar102 + auVar142;
        uVar166 = auVar142._0_8_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar166 & 0xfffffffffffff;
        auVar129 = auVar36 * auVar100 + auVar141 + auVar37 * auVar101 +
                   auVar39 * ZEXT816(0x1000003d10);
        uVar167 = auVar129._0_8_;
        uVar159 = uVar167 & 0xfffffffffffff;
        auVar143._8_8_ = 0;
        auVar143._0_8_ = (uVar167 >> 0x34 | auVar129._8_8_ << 0xc) + (uVar165 & 0xfffffffffffff);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar166 >> 0x34 | auVar142._8_8_ << 0xc;
        auVar143 = auVar40 * ZEXT816(0x1000003d10) + auVar143;
        uVar167 = auVar143._0_8_;
        uVar166 = uVar167 & 0xfffffffffffff;
        uVar165 = (uVar167 >> 0x34 | auVar143._8_8_ << 0xc) + (uVar168 & 0xffffffffffff);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)&nonce32->ecmult_gen_ctx;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar166;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[0];
        auVar104._8_8_ = 0;
        auVar104._0_8_ = uVar159;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[1];
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar164;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[2];
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar157;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[3];
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar165;
        uVar167 = SUB168(auVar45 * auVar107,0);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar167 & 0xfffffffffffff;
        auVar129 = auVar42 * auVar104 + auVar41 * auVar103 + auVar43 * auVar105 + auVar44 * auVar106
                   + auVar46 * ZEXT816(0x1000003d10);
        uVar171 = auVar129._0_8_;
        auVar144._8_8_ = 0;
        auVar144._0_8_ = uVar171 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)&nonce32->ecmult_gen_ctx;
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar165;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[0];
        auVar109._8_8_ = 0;
        auVar109._0_8_ = uVar166;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[1];
        auVar110._8_8_ = 0;
        auVar110._0_8_ = uVar159;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[2];
        auVar111._8_8_ = 0;
        auVar111._0_8_ = uVar164;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[3];
        auVar112._8_8_ = 0;
        auVar112._0_8_ = uVar157;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = uVar167 >> 0x34 | SUB168(auVar45 * auVar107,8) << 0xc;
        auVar129 = auVar47 * auVar108 + auVar144 + auVar48 * auVar109 + auVar49 * auVar110 +
                   auVar50 * auVar111 + auVar51 * auVar112 + auVar52 * ZEXT816(0x1000003d10);
        uVar167 = auVar129._0_8_;
        auVar145._8_8_ = 0;
        auVar145._0_8_ = uVar167 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)&nonce32->ecmult_gen_ctx;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = uVar157;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[0];
        auVar114._8_8_ = 0;
        auVar114._0_8_ = uVar165;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[1];
        auVar115._8_8_ = 0;
        auVar115._0_8_ = uVar166;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[2];
        auVar116._8_8_ = 0;
        auVar116._0_8_ = uVar159;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[3];
        auVar117._8_8_ = 0;
        auVar117._0_8_ = uVar164;
        auVar129 = auVar54 * auVar114 + auVar145 + auVar55 * auVar115 + auVar56 * auVar116 +
                   auVar57 * auVar117;
        uVar161 = auVar129._0_8_;
        auVar147._8_8_ = 0;
        auVar147._0_8_ = uVar161 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar118._8_8_ = 0;
        auVar118._0_8_ = (uVar161 & 0xfffffffffffff) << 4 | (uVar167 & 0xfffffffffffff) >> 0x30;
        auVar129 = auVar53 * auVar113 + ZEXT816(0x1000003d1) * auVar118;
        uVar161 = auVar129._0_8_;
        uStackY_478 = uVar161 & 0xfffffffffffff;
        auVar146._8_8_ = 0;
        auVar146._0_8_ = uVar161 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)&nonce32->ecmult_gen_ctx;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = uVar164;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[0];
        auVar120._8_8_ = 0;
        auVar120._0_8_ = uVar157;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[1];
        auVar121._8_8_ = 0;
        auVar121._0_8_ = uVar165;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[2];
        auVar122._8_8_ = 0;
        auVar122._0_8_ = uVar166;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[3];
        auVar123._8_8_ = 0;
        auVar123._0_8_ = uVar159;
        auVar1 = auVar60 * auVar121 + auVar147 + auVar61 * auVar122 + auVar62 * auVar123;
        uVar161 = auVar1._0_8_;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = uVar161 & 0xfffffffffffff;
        auVar129 = auVar58 * auVar119 + auVar146 + auVar59 * auVar120 +
                   auVar63 * ZEXT816(0x1000003d10);
        uVar168 = auVar129._0_8_;
        auVar149._8_8_ = 0;
        auVar149._0_8_ = uVar161 >> 0x34 | auVar1._8_8_ << 0xc;
        uStackY_470 = uVar168 & 0xfffffffffffff;
        auVar148._8_8_ = 0;
        auVar148._0_8_ = uVar168 >> 0x34 | auVar129._8_8_ << 0xc;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = *(ulong *)&nonce32->ecmult_gen_ctx;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = uVar159;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[0];
        auVar125._8_8_ = 0;
        auVar125._0_8_ = uVar164;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[1];
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar157;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[2];
        auVar127._8_8_ = 0;
        auVar127._0_8_ = uVar165;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = (nonce32->ecmult_gen_ctx).blind.d[3];
        auVar128._8_8_ = 0;
        auVar128._0_8_ = uVar166;
        auVar1 = auVar67 * auVar127 + auVar149 + auVar68 * auVar128;
        uVar159 = auVar1._0_8_;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar159 & 0xfffffffffffff;
        auVar129 = auVar64 * auVar124 + auVar148 + auVar65 * auVar125 + auVar66 * auVar126 +
                   auVar69 * ZEXT816(0x1000003d10);
        uVar166 = auVar129._0_8_;
        uStackY_468 = uVar166 & 0xfffffffffffff;
        auVar150._8_8_ = 0;
        auVar150._0_8_ = (uVar166 >> 0x34 | auVar129._8_8_ << 0xc) + (uVar171 & 0xfffffffffffff);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar159 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar150 = auVar70 * ZEXT816(0x1000003d10) + auVar150;
        uVar159 = auVar150._0_8_;
        uStackY_460 = uVar159 & 0xfffffffffffff;
        lStackY_458 = (uVar159 >> 0x34 | auVar150._8_8_ << 0xc) + (uVar167 & 0xffffffffffff);
        sStackY_4a0.n[0] = (uStackY_478 - uStackY_450) + 0x3ffffbfffff0c3;
        sStackY_4a0.n[1] = (uStackY_470 - uStackY_448) + 0x3ffffffffffffc;
        sStackY_4a0.n[2] = (uStackY_468 - uStackY_440) + 0x3ffffffffffffc;
        sStackY_4a0.n[3] = (uStackY_460 - uStackY_438) + 0x3ffffffffffffc;
        sStackY_4a0.n[4] = (lStackY_458 - lStackY_430) + 0x3fffffffffffc;
        psStackY_428 = psVar163;
        psStackY_420 = pubkey;
        psStackY_418 = psVar160;
        psStackY_410 = keypair;
        psStackY_408 = psVar156;
        pcStackY_400 = unaff_RBP;
        secp256k1_fe_impl_normalizes_to_zero_var(&sStackY_4a0);
        return;
      }
      return;
    }
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_398._16_8_ = 0xd0319f29223809a4;
    local_398._24_8_ = 0x896c4eec98fa2e08;
    local_398._0_8_ = (uchar *)0xd308a385886a3f24;
    local_398._8_8_ = 0x447370032e8a1913;
    local_168._48_8_ = 0x5ebe66e143c6737a;
    local_168._56_8_ = 0xe253c51a4ba3afbe;
    local_168._32_8_ = 0x7c60a644479c23c;
    local_168._40_8_ = 0xefd92309e17a10cd;
    local_168._16_8_ = 0x8ba168852f47f682;
    local_168._24_8_ = 0x56752960147a052f;
    local_168._0_8_ = (void *)0xa4ee5e75d57bf9ff;
    local_168._8_8_ = 0xd3355235143a4520;
    pcStackY_400 = (code *)0x143394;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_398._16_8_ = 0xd0319f29223809a4;
    local_398._24_8_ = 0x896c4eec98fa2e08;
    local_398._0_8_ = (uchar *)0xd308a385886a3f24;
    local_398._8_8_ = 0x447370032e8a1913;
    local_168._48_8_ = 0x355754fe4c952a62;
    local_168._56_8_ = 0xbdb2cdfc3451eaaa;
    local_168._32_8_ = 0x89716edb3e0b8928;
    local_168._40_8_ = 0xf8e45c518b4430b6;
    local_168._16_8_ = 0xf46f3fdf13b032b4;
    local_168._24_8_ = 0x5f51e1e033cb9ff9;
    local_168._0_8_ = (void *)0x1cc2db1e332ea61f;
    local_168._8_8_ = 0xa70011abd2924739;
    pcStackY_400 = (code *)0x143418;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_398._16_8_ = 0xd0319f29223809a4;
    local_398._24_8_ = 0x896c4eec98fa2e08;
    local_398._0_8_ = (uchar *)0xd308a385886a3f24;
    local_398._8_8_ = 0x447370032e8a1913;
    local_168._48_8_ = 0xcedc5003ec9d7e8;
    local_168._56_8_ = 0xa66d2e0c0dff3418;
    local_168._32_8_ = 0xfc2f9baab3641796;
    local_168._40_8_ = 0x26a287687b94efb6;
    local_168._16_8_ = 0x96d9b2896097c174;
    local_168._24_8_ = 0x6977173e54e5a23d;
    local_168._0_8_ = (void *)0xea696ca83b5cff6c;
    local_168._8_8_ = 0x4fcb9b1af376734b;
    pcStackY_400 = (code *)0x14349e;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_398._16_8_ = 0xd0319f29223809a4;
    local_398._24_8_ = 0x896c4eec98fa2e08;
    local_398._0_8_ = (uchar *)0xd308a385886a3f24;
    local_398._8_8_ = 0x447370032e8a1913;
    local_168._48_8_ = 0xdc94d5f07634b74f;
    local_168._56_8_ = 0x516018bd25645cb6;
    local_168._32_8_ = 0x239caf2883da3d12;
    local_168._40_8_ = 0xba23d1cfee1f4ca9;
    local_168._16_8_ = 0;
    local_168._24_8_ = 0;
    local_168._0_8_ = (void *)0x0;
    local_168._8_8_ = 0;
    pcStackY_400 = (code *)0x143524;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_398._16_8_ = 0xd0319f29223809a4;
    local_398._24_8_ = 0x896c4eec98fa2e08;
    local_398._0_8_ = (uchar *)0xd308a385886a3f24;
    local_398._8_8_ = 0x447370032e8a1913;
    local_168._48_8_ = 0xf95467ac117fa8db;
    local_168._56_8_ = 0x97f17c83a1d58037;
    local_168._32_8_ = 0x6488e25aaffb1576;
    local_168._40_8_ = 0xb4adde4297093c01;
    local_168._16_8_ = 0;
    local_168._24_8_ = 0x100000000000000;
    local_168._0_8_ = (void *)0x0;
    local_168._8_8_ = 0;
    pcStackY_400 = (code *)0x1435aa;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_398._16_8_ = 0xd0319f29223809a4;
    local_398._24_8_ = 0x896c4eec98fa2e08;
    local_398._0_8_ = (uchar *)0xd308a385886a3f24;
    local_398._8_8_ = 0x447370032e8a1913;
    local_168._48_8_ = 0x2fb382aea813d7d1;
    local_168._56_8_ = 0x9bd307c47f5f9da7;
    local_168._32_8_ = 0x3d064554c9be869;
    local_168._40_8_ = 0xd75d7897846b1049;
    local_168._16_8_ = 0xc79b260f2ba84d56;
    local_168._24_8_ = 0x1dba290422f8740a;
    local_168._0_8_ = (void *)0x5a3957aeac8d294a;
    local_168._8_8_ = 0xcb1dfddb5d79d015;
    pcStackY_400 = (code *)0x143630;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_398._16_8_ = 0xd0319f29223809a4;
    local_398._24_8_ = 0x896c4eec98fa2e08;
    local_398._0_8_ = (uchar *)0xd308a385886a3f24;
    local_398._8_8_ = 0x447370032e8a1913;
    local_168._48_8_ = 0x2fb382aea813d7d1;
    local_168._56_8_ = 0x9bd307c47f5f9da7;
    local_168._32_8_ = 0x3d064554c9be869;
    local_168._40_8_ = 0xd75d7897846b1049;
    local_168._16_8_ = 0xffffffffffffffff;
    local_168._24_8_ = 0x2ffcfffffeffffff;
    local_168._0_8_ = (void *)0xffffffffffffffff;
    local_168._8_8_ = 0xffffffffffffffff;
    psVar156 = (secp256k1_context *)local_168;
    pcStackY_400 = (code *)0x1436b6;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,(uchar *)psVar156,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_398._16_8_ = (secp256k1_context *)0xd0319f29223809a4;
    local_398._24_8_ = (secp256k1_context *)0x896c4eec98fa2e08;
    local_398._0_8_ = (uchar *)0xd308a385886a3f24;
    local_398._8_8_ = (secp256k1_context *)0x447370032e8a1913;
    local_168._48_8_ = 0x3ba048afe6dcaeba;
    local_168._56_8_ = 0x414136d08c5ed2bf;
    local_168._32_8_ = 0xffffffffffffffff;
    local_168._40_8_ = 0xfeffffffffffffff;
    local_168._16_8_ = 0x96d9b2896097c174;
    local_168._24_8_ = 0x6977173e54e5a23d;
    local_168._0_8_ = (void *)0xea696ca83b5cff6c;
    local_168._8_8_ = 0x4fcb9b1af376734b;
    pcStackY_400 = (code *)0x143736;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xffffffffffffffff;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x30fcfffffeffffff;
    local_228._0_8_ = 0xffffffffffffffff;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    pcStackY_400 = (code *)0x143767;
    nonce32 = CTX;
    iVar151 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar151 != 0) goto LAB_00144831;
    local_228._16_8_ = (void *)0x4003400340034003;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_398._16_8_ = 0x238be6f6b6faf94b;
    local_398._24_8_ = 0x17d16f4d32976408;
    local_398._0_8_ = (uchar *)0xc43a39b453aa8c77;
    local_398._8_8_ = 0x22877a49094d7767;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_168._48_8_ = 0x272865ac0f562d9f;
    local_168._56_8_ = 0x63ab27e47405afd1;
    local_168._32_8_ = 0x624603bf26ce6960;
    local_168._40_8_ = 0x648adb623a9af128;
    local_168._16_8_ = 0xccfc326743adb66b;
    local_168._24_8_ = 0xcf645489551a2925;
    local_168._0_8_ = (void *)0xfbd9ec65b15d5371;
    local_168._8_8_ = 0x1861eafa5f6e04bc;
    local_2b8._40_8_ = (_func_void_char_ptr_void_ptr *)0x0;
    pcStackY_400 = (code *)0x143817;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,(uchar *)0x0,0,local_168);
    pcStackY_400 = (code *)0x14382c;
    test_schnorrsig_bip_vectors_check_verify(local_398,(uchar *)0x0,0,local_168,1);
    local_228._16_8_ = (void *)0x4003400340034003;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_398._16_8_ = 0x238be6f6b6faf94b;
    local_398._24_8_ = 0x17d16f4d32976408;
    local_398._0_8_ = (uchar *)0xc43a39b453aa8c77;
    local_398._8_8_ = 0x22877a49094d7767;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    unaff_RBP = (code *)CONCAT71((int7)((ulong)unaff_RBP >> 8),0x11);
    local_338[0] = 0x11;
    local_168._48_8_ = 0x337d575afcac7cfe;
    local_168._56_8_ = 0xbfac2bec4c5614ec;
    local_168._32_8_ = 0xbd8366eabf7331ea;
    local_168._40_8_ = 0x9619bc5daaa51f10;
    local_168._16_8_ = 0x354c3be64a93b9b1;
    local_168._24_8_ = 0x3a3c63411aef311;
    local_168._0_8_ = (void *)0x2441f6fe0a0aa208;
    local_168._8_8_ = 0x3a583c69e0329264;
    pcStackY_400 = (code *)0x1438da;
    test_schnorrsig_bip_vectors_check_signing(local_228,local_398,local_288,local_338,1,local_168);
    pcStackY_400 = (code *)0x1438f3;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338,1,local_168,1);
    local_228._16_8_ = (void *)0x4003400340034003;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_398._16_8_ = 0x238be6f6b6faf94b;
    local_398._24_8_ = 0x17d16f4d32976408;
    local_398._0_8_ = (uchar *)0xc43a39b453aa8c77;
    local_398._8_8_ = 0x22877a49094d7767;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_338[0x10] = 0x11;
    local_338._0_8_ = 0x807060504030201;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0x100f0e0d0c0b0a09;
    local_168._48_8_ = 0x515a0ed87fa3e5e1;
    local_168._56_8_ = 0xa5a57ea966557c89;
    local_168._32_8_ = 0xf860f97bb782a4c4;
    local_168._40_8_ = 0xec71675be2401568;
    local_168._16_8_ = 0x523c1ea7d199865d;
    local_168._24_8_ = 0x70c30ab5b6fd9ada;
    local_168._0_8_ = (void *)0x3bb459409af33051;
    local_168._8_8_ = 0x2be5ec199ac0cac7;
    keypair = (secp256k1_context *)local_228;
    psVar156 = (secp256k1_context *)local_398;
    pcStackY_400 = (code *)0x1439ac;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)keypair,(uchar *)psVar156,local_288,local_338,0x11,local_168);
    pcStackY_400 = (code *)0x1439c5;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar156,local_338,0x11,local_168,1);
    local_398._16_8_ = (secp256k1_context *)0x4003400340034003;
    local_398._24_8_ = (secp256k1_context *)0x4003400340034003;
    local_398._0_8_ = (uchar *)0x4003400340034003;
    local_398._8_8_ = (secp256k1_context *)0x4003400340034003;
    local_278._8_8_ = 0x17d16f4d32976408;
    local_278._0_8_ = 0x238be6f6b6faf94b;
    local_288._8_8_ = 0x22877a49094d7767;
    local_288._0_8_ = 0xc43a39b453aa8c77;
    local_338._16_8_ = (void *)0x0;
    local_338._24_8_ = 0;
    local_338._0_8_ = 0;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_228._48_8_ = (void *)0xa0b4d0e9a0cb7f89;
    local_228._56_8_ = 0x6723f249d2cf9468;
    local_228._32_8_ = (void *)0xe7070817e3d35e58;
    local_228._40_8_ = (_func_void_char_ptr_void_ptr *)0x237b4cc50f723bc0;
    local_228._16_8_ = (void *)0x6fbea8bf5d1e3203;
    local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0xa879ca3e16351609;
    local_228._0_8_ = 0x345a55d8b0123b40;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x635646c77eea7541;
    local_168._80_8_ = 0x9999999999999999;
    local_168._88_8_ = 0x9999999999999999;
    local_168._64_8_ = 0x9999999999999999;
    local_168._72_8_ = 0x9999999999999999;
    local_168._48_8_ = 0x9999999999999999;
    local_168._56_8_ = 0x9999999999999999;
    local_168._32_8_ = 0x9999999999999999;
    local_168._40_8_ = 0x9999999999999999;
    local_168._16_8_ = 0x9999999999999999;
    local_168._24_8_ = 0x9999999999999999;
    local_168._0_8_ = (void *)0x9999999999999999;
    local_168._8_8_ = 0x9999999999999999;
    local_168._96_4_ = 0x99999999;
    key32 = (secp256k1_context *)local_228;
    pcStackY_400 = (code *)0x143a96;
    test_schnorrsig_bip_vectors_check_signing
              (local_398,local_288,local_338,local_168,100,(uchar *)key32);
    pcStackY_400 = (code *)0x143aaf;
    test_schnorrsig_bip_vectors_check_verify(local_288,local_168,100,(uchar *)key32,1);
    if (COUNT < 1) {
LAB_001443b4:
      psVar155 = (secp256k1_context *)local_168;
      pubkey = (secp256k1_context *)local_228;
      psVar163 = (secp256k1_schnorrsig_extraparams *)local_338;
      pcStackY_400 = (code *)0x1443c4;
      secp256k1_testrand256((uchar *)psVar163);
      pcStackY_400 = (code *)0x1443db;
      nonce32 = CTX;
      iVar151 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)psVar163);
      if (iVar151 == 0) goto LAB_00144836;
      pcStackY_400 = (code *)0x144401;
      nonce32 = CTX;
      iVar151 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                           (secp256k1_keypair *)local_168);
      if (iVar151 == 0) goto LAB_0014483b;
      pcStackY_400 = (code *)0x144425;
      nonce32 = CTX;
      iVar151 = secp256k1_xonly_pubkey_serialize
                          (CTX,local_2f8 + 0x20,(secp256k1_xonly_pubkey *)local_228);
      if (iVar151 == 0) goto LAB_00144840;
      pcStackY_400 = (code *)0x144449;
      nonce32 = CTX;
      iVar151 = secp256k1_keypair_xonly_tweak_add
                          (CTX,(secp256k1_keypair *)local_168,local_2f8 + 0x20);
      if (iVar151 != 1) goto LAB_00144845;
      pcStackY_400 = (code *)0x144470;
      nonce32 = CTX;
      iVar151 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)local_398,(int *)local_3b8,
                           (secp256k1_keypair *)local_168);
      if (iVar151 == 0) goto LAB_0014484a;
      pcStackY_400 = (code *)0x144491;
      nonce32 = CTX;
      iVar151 = secp256k1_xonly_pubkey_serialize(CTX,local_2f8,(secp256k1_xonly_pubkey *)local_398);
      if (iVar151 == 0) goto LAB_0014484f;
      psVar163 = (secp256k1_schnorrsig_extraparams *)local_3d8;
      pcStackY_400 = (code *)0x1444a6;
      secp256k1_testrand256((uchar *)psVar163);
      pcStackY_400 = (code *)0x1444d9;
      nonce32 = CTX;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_288,(uchar *)psVar163,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 == 0) goto LAB_00144854;
      pcStackY_400 = (code *)0x1444fa;
      nonce32 = CTX;
      iVar151 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_398,local_2f8);
      if (iVar151 == 0) goto LAB_00144859;
      pcStackY_400 = (code *)0x144525;
      nonce32 = CTX;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_288,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_398);
      if (iVar151 == 0) goto LAB_0014485e;
      pcStackY_400 = (code *)0x144549;
      nonce32 = CTX;
      iVar151 = secp256k1_xonly_pubkey_serialize(CTX,local_2b8,(secp256k1_xonly_pubkey *)local_228);
      if (iVar151 == 0) goto LAB_00144863;
      pcStackY_400 = (code *)0x14456d;
      nonce32 = CTX;
      iVar151 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_228,local_2b8);
      if (iVar151 != 0) {
        pcStackY_400 = (code *)0x14459d;
        nonce32 = CTX;
        iVar151 = secp256k1_xonly_pubkey_tweak_add_check
                            (CTX,local_2f8,local_3b8._0_4_,(secp256k1_xonly_pubkey *)local_228,
                             local_2f8 + 0x20);
        if (iVar151 != 0) {
          return;
        }
        goto LAB_0014486d;
      }
      goto LAB_00144868;
    }
    keypair = (secp256k1_context *)local_288;
    while( true ) {
      pubkey = (secp256k1_context *)local_228;
      unaff_RBP = nonce_function_bip340;
      local_2f8._16_8_ = (void *)0x6e68637320612072;
      local_2f8._24_8_ = (_func_void_char_ptr_void_ptr *)0x2e2e67697372726f;
      local_2f8._0_8_ = (void *)0x2073692073696874;
      local_2f8._8_8_ = (_func_void_char_ptr_void_ptr *)0x6f662067736d2061;
      local_338._48_8_ = (void *)0x0;
      local_338._56_8_ = (_func_void_char_ptr_void_ptr *)0x0;
      local_338._32_8_ = 0;
      local_338._40_8_ = (_func_void_char_ptr_void_ptr *)0x0;
      local_338._16_8_ = (void *)0x0;
      local_338._24_8_ = 0;
      local_338._0_8_ = 0;
      local_338._8_8_ = (secp256k1_nonce_function_hardened)0x0;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = local_3c8._8_8_;
      local_3c8 = auVar129 << 0x40;
      local_3d8 = ZEXT816(0x8cb36fda);
      pcStackY_400 = (code *)0x143b36;
      secp256k1_testrand256(local_2b8);
      pcStackY_400 = (code *)0x143b43;
      secp256k1_testrand256(local_2f8 + 0x20);
      pcStackY_400 = (code *)0x143b55;
      iVar151 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,local_2b8);
      if (iVar151 == 0) break;
      pcStackY_400 = (code *)0x143b71;
      key32 = (secp256k1_context *)local_168;
      iVar151 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)pubkey,(int *)0x0,
                           (secp256k1_keypair *)local_168);
      if (iVar151 == 0) goto LAB_001445d0;
      key32 = (secp256k1_context *)0x20;
      psVar160 = (secp256k1_context *)local_2f8;
      pcStackY_400 = (code *)0x143bab;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)local_398,(uchar *)psVar160,0x20,
                           (secp256k1_keypair *)local_168,nonce_function_bip340,(void *)0x0);
      if (iVar151 == 0) goto LAB_001445d5;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143bcd;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)local_398,(uchar *)psVar160,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      if (iVar151 == 0) goto LAB_001445da;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143bff;
      nonce32 = CTX;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)psVar160,0x20,
                           (secp256k1_keypair *)local_168,nonce_function_bip340,(void *)0x0);
      if (iVar151 == 0) goto LAB_001445df;
      lVar154 = 0;
      psVar163 = (secp256k1_schnorrsig_extraparams *)local_3d8;
      do {
        psVar155 = psVar160;
        psVar156 = (secp256k1_context *)local_398;
        if (local_398[lVar154] != local_288[lVar154]) goto LAB_00144872;
        lVar154 = lVar154 + 1;
      } while (lVar154 != 0x40);
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143c4f;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_398,(uchar *)psVar160,0x20,(secp256k1_keypair *)local_168,
                           psVar163);
      if (iVar151 == 0) goto LAB_001445e4;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143c71;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_398,(uchar *)psVar160,0x20,(secp256k1_xonly_pubkey *)pubkey);
      if (iVar151 == 0) goto LAB_001445e9;
      uStack_360 = 0x101010101010101;
      local_398._48_8_ = 0x101010101010101;
      local_398._32_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398._40_8_ = 0x101010101010101;
      local_398._16_8_ = (secp256k1_context *)0x101010101010101;
      local_398._24_8_ = (secp256k1_context *)0x101010101010101;
      local_398._0_8_ = (uchar *)0x101010101010101;
      local_398._8_8_ = (secp256k1_context *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_failing;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143ccd;
      nonce32 = CTX;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_398,(uchar *)psVar160,0x20,(secp256k1_keypair *)local_168,
                           psVar163);
      if (iVar151 != 0) goto LAB_001445ee;
      lVar154 = 0;
      psVar155 = (secp256k1_context *)local_168;
      do {
        if (local_398[lVar154] != local_338[lVar154]) goto LAB_00144877;
        lVar154 = lVar154 + 1;
      } while (lVar154 != 0x40);
      uStack_360 = 0x101010101010101;
      local_398._48_8_ = 0x101010101010101;
      local_398._32_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398._40_8_ = 0x101010101010101;
      local_398._16_8_ = (secp256k1_context *)0x101010101010101;
      local_398._24_8_ = (secp256k1_context *)0x101010101010101;
      local_398._0_8_ = (uchar *)0x101010101010101;
      local_398._8_8_ = (secp256k1_context *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_0;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143d4d;
      nonce32 = CTX;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_398,(uchar *)psVar160,0x20,(secp256k1_keypair *)psVar155,
                           psVar163);
      if (iVar151 != 0) goto LAB_001445f3;
      lVar154 = 0;
      do {
        psVar156 = psVar160;
        if (local_398[lVar154] != local_338[lVar154]) goto LAB_0014487c;
        lVar154 = lVar154 + 1;
      } while (lVar154 != 0x40);
      uStack_360 = 0x101010101010101;
      local_398._48_8_ = 0x101010101010101;
      local_398._32_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398._40_8_ = 0x101010101010101;
      local_398._16_8_ = (secp256k1_context *)0x101010101010101;
      local_398._24_8_ = (secp256k1_context *)0x101010101010101;
      local_398._0_8_ = (uchar *)0x101010101010101;
      local_398._8_8_ = (secp256k1_context *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_overflowing;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143dc8;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_398,(uchar *)psVar160,0x20,(secp256k1_keypair *)psVar155,
                           psVar163);
      if (iVar151 == 0) goto LAB_001445f8;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143dea;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_398,(uchar *)psVar160,0x20,(secp256k1_xonly_pubkey *)pubkey);
      if (iVar151 == 0) goto LAB_001445fd;
      local_3d8._8_8_ = 0;
      local_3c8._0_8_ = local_2f8 + 0x20;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143e2d;
      iVar151 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_398,(uchar *)psVar160,0x20,(secp256k1_keypair *)local_168,
                           psVar163);
      if (iVar151 == 0) goto LAB_00144602;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143e5e;
      nonce32 = CTX;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)psVar160,0x20,
                           (secp256k1_keypair *)local_168,nonce_function_bip340,
                           (void *)local_3c8._0_8_);
      if (iVar151 == 0) goto LAB_00144607;
      lVar154 = 0;
      psVar163 = (secp256k1_schnorrsig_extraparams *)local_338;
      do {
        key32 = (secp256k1_context *)CONCAT71((int7)((ulong)key32 >> 8),local_398[lVar154]);
        psVar156 = keypair;
        if (local_398[lVar154] != local_288[lVar154]) goto LAB_00144881;
        lVar154 = lVar154 + 1;
      } while (lVar154 != 0x40);
      pcStackY_400 = (code *)0x143e9a;
      secp256k1_testrand256(local_2b8);
      pcStackY_400 = (code *)0x143eac;
      iVar151 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,local_2b8);
      if (iVar151 == 0) goto LAB_0014460c;
      pcStackY_400 = (code *)0x143ec8;
      key32 = keypair;
      iVar151 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)psVar163,(int *)0x0,
                           (secp256k1_keypair *)keypair);
      if (iVar151 == 0) goto LAB_00144611;
      lVar154 = 0;
      do {
        puVar170 = local_398 + lVar154;
        pcStackY_400 = (code *)0x143ee6;
        secp256k1_testrand256(puVar170);
        key32 = (secp256k1_context *)0x20;
        pcStackY_400 = (code *)0x143f0b;
        iVar151 = secp256k1_schnorrsig_sign_internal
                            (CTX,(uchar *)pubkey,puVar170,0x20,(secp256k1_keypair *)keypair,
                             nonce_function_bip340,(void *)0x0);
        if (iVar151 == 0) {
          pcStackY_400 = (code *)0x1445bc;
          run_schnorrsig_tests_cold_72();
LAB_001445bc:
          pcStackY_400 = (code *)0x1445c1;
          run_schnorrsig_tests_cold_71();
LAB_001445c1:
          pcStackY_400 = (code *)0x1445c6;
          run_schnorrsig_tests_cold_103();
LAB_001445c6:
          pcStackY_400 = (code *)0x1445cb;
          run_schnorrsig_tests_cold_101();
          goto LAB_001445cb;
        }
        key32 = (secp256k1_context *)0x20;
        pcStackY_400 = (code *)0x143f2d;
        iVar151 = secp256k1_schnorrsig_verify
                            (CTX,(uchar *)pubkey,puVar170,0x20,(secp256k1_xonly_pubkey *)psVar163);
        if (iVar151 == 0) goto LAB_001445bc;
        lVar154 = lVar154 + 0x20;
        pubkey = (secp256k1_context *)((pubkey->ecmult_gen_ctx).initial.x.n + 3);
      } while (lVar154 != 0x60);
      pcStackY_400 = (code *)0x143f4d;
      uVar152 = secp256k1_testrand_int(3);
      uVar171 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar166 = secp256k1_test_state[1] << 0x11;
      uVar167 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar159 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar167;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar159;
      secp256k1_test_state[2] = uVar167 ^ uVar166;
      secp256k1_test_state[3] = uVar159 << 0x2d | uVar159 >> 0x13;
      uVar171 = uVar171 >> 0x3b;
      pcStackY_400 = (code *)0x143fba;
      uVar153 = secp256k1_testrand_int(0xfe);
      puVar170 = local_228 + (ulong)uVar152 * 0x40;
      bVar172 = (char)uVar153 + 1;
      puVar170[uVar171] = puVar170[uVar171] ^ bVar172;
      unaff_RBP = (code *)(local_398 + (ulong)uVar152 * 0x20);
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x143ffc;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,puVar170,(uchar *)unaff_RBP,0x20,(secp256k1_xonly_pubkey *)psVar163);
      if (iVar151 != 0) goto LAB_00144616;
      puVar170[uVar171] = puVar170[uVar171] ^ bVar172;
      uVar171 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar166 = secp256k1_test_state[1] << 0x11;
      uVar167 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar159 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar167;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar159;
      secp256k1_test_state[2] = uVar167 ^ uVar166;
      secp256k1_test_state[3] = uVar159 << 0x2d | uVar159 >> 0x13;
      uVar171 = uVar171 >> 0x3b;
      puVar170[uVar171 + 0x20] = puVar170[uVar171 + 0x20] ^ bVar172;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x14408b;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,puVar170,(uchar *)unaff_RBP,0x20,(secp256k1_xonly_pubkey *)psVar163);
      if (iVar151 != 0) goto LAB_0014461b;
      puVar170[uVar171 + 0x20] = puVar170[uVar171 + 0x20] ^ bVar172;
      uVar171 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar166 = secp256k1_test_state[1] << 0x11;
      uVar167 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar159 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar167;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar159;
      secp256k1_test_state[2] = uVar167 ^ uVar166;
      secp256k1_test_state[3] = uVar159 << 0x2d | uVar159 >> 0x13;
      uVar171 = uVar171 >> 0x3b;
      unaff_RBP[uVar171] = (code)((byte)unaff_RBP[uVar171] ^ bVar172);
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x14411e;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,puVar170,(uchar *)unaff_RBP,0x20,(secp256k1_xonly_pubkey *)psVar163);
      if (iVar151 != 0) goto LAB_00144620;
      unaff_RBP[uVar171] = (code)((byte)unaff_RBP[uVar171] ^ bVar172);
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x144147;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,puVar170,(uchar *)unaff_RBP,0x20,(secp256k1_xonly_pubkey *)psVar163);
      if (iVar151 == 0) goto LAB_00144625;
      key32 = (secp256k1_context *)0x20;
      unaff_RBP = (code *)local_398;
      pcStackY_400 = (code *)0x144188;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_228,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 == 0) goto LAB_0014462a;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x1441aa;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_228,(uchar *)unaff_RBP,0x20,(secp256k1_xonly_pubkey *)psVar163)
      ;
      if (iVar151 == 0) goto LAB_0014462f;
      local_228._48_8_ = (void *)0xffffffffffffffff;
      local_228._56_8_ = 0xffffffffffffffff;
      local_228._32_8_ = (void *)0xffffffffffffffff;
      local_228._40_8_ = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x1441e3;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_228,(uchar *)unaff_RBP,0x20,(secp256k1_xonly_pubkey *)psVar163)
      ;
      if (iVar151 != 0) goto LAB_00144634;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x144210;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_228,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar151 == 0) goto LAB_00144639;
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x144232;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_228,(uchar *)unaff_RBP,0x20,(secp256k1_xonly_pubkey *)psVar163)
      ;
      if (iVar151 == 0) goto LAB_0014463e;
      pcStackY_400 = (code *)0x14424f;
      secp256k1_scalar_set_b32((secp256k1_scalar *)local_2f8,local_228 + 0x20,(int *)0x0);
      pcStackY_400 = (code *)0x14425a;
      secp256k1_scalar_negate((secp256k1_scalar *)local_2f8,(secp256k1_scalar *)local_2f8);
      pcStackY_400 = (code *)0x144265;
      secp256k1_scalar_get_b32(local_228 + 0x20,(secp256k1_scalar *)local_2f8);
      key32 = (secp256k1_context *)0x20;
      pcStackY_400 = (code *)0x14427f;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_228,(uchar *)unaff_RBP,0x20,(secp256k1_xonly_pubkey *)psVar163)
      ;
      if (iVar151 != 0) goto LAB_00144643;
      key32 = (secp256k1_context *)0x0;
      pcStackY_400 = (code *)0x1442ab;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_228,(uchar *)0x0,0,(secp256k1_keypair *)keypair,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      if (iVar151 == 0) goto LAB_00144648;
      key32 = (secp256k1_context *)0x0;
      pcStackY_400 = (code *)0x1442c9;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_228,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)psVar163);
      if (iVar151 == 0) goto LAB_0014464d;
      pcStackY_400 = (code *)0x1442db;
      uVar152 = secp256k1_testrand_int(0x100);
      unaff_RBP = (code *)(ulong)uVar152;
      uVar159 = 0xffffffffffffffe0;
      do {
        pcStackY_400 = (code *)0x1442f9;
        secp256k1_testrand256(local_168 + uVar159 + 0x20);
        uVar159 = uVar159 + 0x20;
      } while (uVar159 < 0xe0);
      key32 = (secp256k1_context *)(ulong)uVar152;
      pcStackY_400 = (code *)0x14432c;
      psVar160 = key32;
      iVar151 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_228,local_168,(size_t)key32,(secp256k1_keypair *)keypair,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      if (iVar151 == 0) goto LAB_00144652;
      psVar156 = (secp256k1_context *)local_338;
      pcStackY_400 = (code *)0x144354;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_228,local_168,(size_t)key32,(secp256k1_xonly_pubkey *)psVar156)
      ;
      if (iVar151 == 0) goto LAB_00144657;
      unaff_RBP = (code *)(ulong)(uVar152 - 1);
      key32 = (secp256k1_context *)((ulong)unaff_RBP & 0xff);
      pcStackY_400 = (code *)0x144377;
      iVar151 = secp256k1_schnorrsig_verify
                          (CTX,local_228,local_168,(size_t)key32,(secp256k1_xonly_pubkey *)psVar156)
      ;
      if (iVar151 != 0) goto LAB_0014465c;
      uVar162 = (int)local_2b8._40_8_ + 1;
      local_2b8._40_8_ = ZEXT48(uVar162);
      unaff_RBP = nonce_function_bip340;
      if (COUNT <= (int)uVar162) goto LAB_001443b4;
    }
LAB_001445cb:
    pcStackY_400 = (code *)0x1445d0;
    run_schnorrsig_tests_cold_85();
LAB_001445d0:
    pcStackY_400 = (code *)0x1445d5;
    run_schnorrsig_tests_cold_84();
LAB_001445d5:
    pcStackY_400 = (code *)0x1445da;
    run_schnorrsig_tests_cold_83();
LAB_001445da:
    pcStackY_400 = (code *)0x1445df;
    run_schnorrsig_tests_cold_82();
LAB_001445df:
    pcStackY_400 = (code *)0x1445e4;
    run_schnorrsig_tests_cold_81();
LAB_001445e4:
    pcStackY_400 = (code *)0x1445e9;
    run_schnorrsig_tests_cold_80();
LAB_001445e9:
    pcStackY_400 = (code *)0x1445ee;
    run_schnorrsig_tests_cold_79();
LAB_001445ee:
    pcStackY_400 = (code *)0x1445f3;
    run_schnorrsig_tests_cold_39();
LAB_001445f3:
    pcStackY_400 = (code *)0x1445f8;
    run_schnorrsig_tests_cold_41();
LAB_001445f8:
    pcStackY_400 = (code *)0x1445fd;
    run_schnorrsig_tests_cold_78();
LAB_001445fd:
    pcStackY_400 = (code *)0x144602;
    run_schnorrsig_tests_cold_77();
LAB_00144602:
    pcStackY_400 = (code *)0x144607;
    run_schnorrsig_tests_cold_76();
LAB_00144607:
    pcStackY_400 = (code *)0x14460c;
    run_schnorrsig_tests_cold_75();
LAB_0014460c:
    pcStackY_400 = (code *)0x144611;
    run_schnorrsig_tests_cold_74();
LAB_00144611:
    pcStackY_400 = (code *)0x144616;
    run_schnorrsig_tests_cold_73();
LAB_00144616:
    pcStackY_400 = (code *)0x14461b;
    run_schnorrsig_tests_cold_44();
LAB_0014461b:
    pcStackY_400 = (code *)0x144620;
    run_schnorrsig_tests_cold_45();
LAB_00144620:
    pcStackY_400 = (code *)0x144625;
    run_schnorrsig_tests_cold_46();
LAB_00144625:
    pcStackY_400 = (code *)0x14462a;
    run_schnorrsig_tests_cold_70();
LAB_0014462a:
    pcStackY_400 = (code *)0x14462f;
    run_schnorrsig_tests_cold_69();
LAB_0014462f:
    pcStackY_400 = (code *)0x144634;
    run_schnorrsig_tests_cold_68();
LAB_00144634:
    pcStackY_400 = (code *)0x144639;
    run_schnorrsig_tests_cold_47();
LAB_00144639:
    pcStackY_400 = (code *)0x14463e;
    run_schnorrsig_tests_cold_67();
LAB_0014463e:
    pcStackY_400 = (code *)0x144643;
    run_schnorrsig_tests_cold_66();
LAB_00144643:
    pcStackY_400 = (code *)0x144648;
    run_schnorrsig_tests_cold_48();
LAB_00144648:
    pcStackY_400 = (code *)0x14464d;
    run_schnorrsig_tests_cold_65();
LAB_0014464d:
    pcStackY_400 = (code *)0x144652;
    run_schnorrsig_tests_cold_64();
    psVar160 = key32;
LAB_00144652:
    key32 = psVar160;
    pcStackY_400 = (code *)0x144657;
    run_schnorrsig_tests_cold_63();
LAB_00144657:
    pcStackY_400 = (code *)0x14465c;
    run_schnorrsig_tests_cold_62();
LAB_0014465c:
    pcStackY_400 = (code *)0x144661;
    run_schnorrsig_tests_cold_49();
LAB_00144661:
    pcStackY_400 = (code *)0x144666;
    run_schnorrsig_tests_cold_102();
LAB_00144666:
    pcStackY_400 = (code *)0x14466b;
    run_schnorrsig_tests_cold_100();
LAB_0014466b:
    pcStackY_400 = (code *)0x144670;
    run_schnorrsig_tests_cold_105();
LAB_00144670:
    pcStackY_400 = (code *)0x144675;
    run_schnorrsig_tests_cold_104();
LAB_00144675:
    pcStackY_400 = (code *)0x14467a;
    run_schnorrsig_tests_cold_99();
LAB_0014467a:
    pcStackY_400 = (code *)0x14467f;
    run_schnorrsig_tests_cold_98();
LAB_0014467f:
    pcStackY_400 = (code *)0x144693;
    (*(key32->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(key32->illegal_callback).data);
    psVar155 = secp256k1_context_static;
    psVar158 = CTX;
  } while( true );
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}